

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

int mpz_cmpabs_d(__mpz_struct *x,double d)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  uVar1 = x->_mp_size;
  uVar4 = -(ulong)(-d <= d);
  dVar5 = (double)(~uVar4 & (ulong)-d | (ulong)d & uVar4);
  if (uVar1 != 0) {
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar3 = (ulong)uVar2;
    uVar4 = uVar3;
    while (uVar4 = uVar4 - 1, uVar4 != 0) {
      dVar5 = dVar5 * 5.421010862427522e-20;
    }
    if (1.8446744073709552e+19 <= dVar5) {
      return -1;
    }
    for (; 0 < (long)uVar3; uVar3 = uVar3 - 1) {
      uVar4 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
      if (uVar4 < x->_mp_d[uVar3 - 1]) {
        return 1;
      }
      if (x->_mp_d[uVar3 - 1] < uVar4) {
        return -1;
      }
      auVar6._8_4_ = (int)(uVar4 >> 0x20);
      auVar6._0_8_ = uVar4;
      auVar6._12_4_ = 0x45300000;
      dVar5 = (dVar5 - ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0))) *
              1.8446744073709552e+19;
    }
  }
  return -(uint)(0.0 < dVar5);
}

Assistant:

int
mpz_cmpabs_d (const mpz_t x, double d)
{
  mp_size_t xn;
  double B, Bi;
  mp_size_t i;

  xn = x->_mp_size;
  d = GMP_ABS (d);

  if (xn != 0)
    {
      xn = GMP_ABS (xn);

      B = 2.0 * (double) GMP_LIMB_HIGHBIT;
      Bi = 1.0 / B;

      /* Scale d so it can be compared with the top limb. */
      for (i = 1; i < xn; i++)
	d *= Bi;

      if (d >= B)
	return -1;

      /* Compare floor(d) to top limb, subtract and cancel when equal. */
      for (i = xn; i-- > 0;)
	{
	  mp_limb_t f, xl;

	  f = (mp_limb_t) d;
	  xl = x->_mp_d[i];
	  if (xl > f)
	    return 1;
	  else if (xl < f)
	    return -1;
	  d = B * (d - f);
	}
    }
  return - (d > 0.0);
}